

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

int luaT_callorderTM(lua_State *L,TValue *p1,TValue *p2,TMS event)

{
  int iVar1;
  bool local_25;
  TMS event_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  iVar1 = callbinTM(L,p1,p2,(L->top).p,event);
  if (iVar1 != 0) {
    local_25 = true;
    if (*(char *)((L->top).offset + 8) != '\x01') {
      local_25 = (*(byte *)((L->top).offset + 8) & 0xf) == 0;
    }
    return (int)((local_25 ^ 0xffU) & 1);
  }
  luaG_ordererror(L,p1,p2);
}

Assistant:

int luaT_callorderTM (lua_State *L, const TValue *p1, const TValue *p2,
                      TMS event) {
  if (callbinTM(L, p1, p2, L->top.p, event))  /* try original event */
    return !l_isfalse(s2v(L->top.p));
#if defined(LUA_COMPAT_LT_LE)
  else if (event == TM_LE) {
      /* try '!(p2 < p1)' for '(p1 <= p2)' */
      L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
      if (callbinTM(L, p2, p1, L->top.p, TM_LT)) {
        L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
        return l_isfalse(s2v(L->top.p));
      }
      /* else error will remove this 'ci'; no need to clear mark */
  }
#endif
  luaG_ordererror(L, p1, p2);  /* no metamethod found */
  return 0;  /* to avoid warnings */
}